

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O2

string * __thiscall
verilogAST::Always::toString_abi_cxx11_(string *__return_storage_ptr__,Always *this)

{
  pointer pvVar1;
  pointer puVar2;
  Always *pAVar3;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>
  *it;
  pointer pvVar4;
  pointer puVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sensitivity_strs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  Always *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_d0);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = (this->sensitivity_list).
           super__Vector_base<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_b0 = this;
  for (pvVar4 = (this->sensitivity_list).
                super__Vector_base<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar4 != pvVar1; pvVar4 = pvVar4 + 1) {
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/src/verilogAST.cpp:10:7)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>_&>
      ::_S_vtable._M_arr
      [(pvVar4->
       super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>
       ).
       super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::PosEdge>,_std::unique_ptr<verilogAST::NegEdge>,_std::unique_ptr<verilogAST::Star>_>
       .
       super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::PosEdge>,_std::unique_ptr<verilogAST::NegEdge>,_std::unique_ptr<verilogAST::Star>_>
       .
       super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::PosEdge>,_std::unique_ptr<verilogAST::NegEdge>,_std::unique_ptr<verilogAST::Star>_>
       .
       super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::PosEdge>,_std::unique_ptr<verilogAST::NegEdge>,_std::unique_ptr<verilogAST::Star>_>
       .
       super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::PosEdge>,_std::unique_ptr<verilogAST::NegEdge>,_std::unique_ptr<verilogAST::Star>_>
       ._M_index]._M_data)(&local_d0,(anon_class_1_0_00000001 *)&local_70,pvVar4);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
               &local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,", ",(allocator<char> *)&local_70);
  pAVar3 = local_b0;
  join(&local_d0,&local_88,&local_50);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  puVar2 = (pAVar3->body).
           super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (pAVar3->body).
                super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    (*(code *)**(undefined8 **)
                (puVar5->_M_t).
                super___uniq_ptr_impl<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::BehavioralStatement_*,_std::default_delete<verilogAST::BehavioralStatement>_>
                .super__Head_base<0UL,_verilogAST::BehavioralStatement_*,_false>._M_head_impl)
              (&local_70);
    std::operator+(&local_d0,&local_70,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Always::toString() {
  std::string always_str = "";
  always_str += "always @(";

  // emit sensitivity string
  std::vector<std::string> sensitivity_strs;
  for (auto &it : sensitivity_list) {
    sensitivity_strs.push_back(variant_to_string(it));
  }
  always_str += join(sensitivity_strs, ", ");
  always_str += ") begin\n";

  // emit body
  for (auto &statement : body) {
    always_str += statement->toString() + "\n";
  }

  always_str += "end\n";
  return always_str;
}